

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall ft::list<int,_ft::allocator<int>_>::reverse(list<int,_ft::allocator<int>_> *this)

{
  listNode<int> *plVar1;
  listNode<int> *plVar2;
  node *pnVar3;
  listNode<int> *plVar4;
  
  if (1 < this->m_size) {
    plVar4 = this->m_head->next;
    while (plVar1 = this->m_tail, plVar4 != plVar1) {
      plVar1 = plVar4->prev;
      plVar2 = plVar4->next;
      plVar4->prev = plVar2;
      plVar4->next = plVar1;
      plVar4 = plVar2;
    }
    pnVar3 = this->m_head;
    this->m_head = plVar1;
    this->m_tail = pnVar3;
    plVar4 = plVar1->prev;
    plVar1->prev = plVar1->next;
    plVar1->next = plVar4;
    pnVar3 = this->m_tail;
    plVar4 = pnVar3->prev;
    pnVar3->prev = pnVar3->next;
    pnVar3->next = plVar4;
  }
  return;
}

Assistant:

void reverse() {
		if (this->size() > 1) {
			for (iterator it = this->begin(); it != this->end(); --it)
				ft::swap(it.node()->prev, it.node()->next);
			ft::swap(this->m_head, this->m_tail);
			ft::swap(this->head()->prev, this->head()->next);
			ft::swap(this->tail()->prev, this->tail()->next);
		}
	}